

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall basisu::basis_compressor::process_backend(basis_compressor *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint32_t uVar4;
  params *ppVar5;
  long in_RDI;
  undefined1 uVar6;
  uint32_t total_packed_bytes;
  basisu_backend_params backend_params;
  undefined2 in_stack_ffffffffffffffee;
  
  debug_printf("basis_compressor::process_backend\n");
  basisu_backend_params::basisu_backend_params((basisu_backend_params *)0x4bc91b);
  bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x6c));
  bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x70));
  iVar3 = param::operator_cast_to_int((param *)(in_RDI + 0x74));
  bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0xa0));
  if (!bVar1) {
    param::operator_cast_to_float((param *)(in_RDI + 0xa4));
  }
  bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x8a));
  if (!bVar1) {
    param::operator_cast_to_float((param *)(in_RDI + 0x8c));
  }
  ppVar5 = basisu_frontend::get_params((basisu_frontend *)(in_RDI + 0x298));
  uVar6 = ppVar5->m_pGlobal_codebooks != (basisu_lowlevel_etc1s_transcoder *)0x0;
  uVar2 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x23e));
  basisu_backend::init((basisu_backend *)(in_RDI + 0x498),(EVP_PKEY_CTX *)(in_RDI + 0x298));
  uVar4 = basisu_backend::encode
                    ((basisu_backend *)
                     CONCAT26(in_stack_ffffffffffffffee,CONCAT15(uVar2,CONCAT14(uVar6,iVar3))));
  if (uVar4 != 0) {
    debug_printf("Total packed bytes (estimated): %u\n",(ulong)uVar4);
  }
  else {
    error_printf("basis_compressor::encode() failed!\n");
  }
  return uVar4 != 0;
}

Assistant:

bool basis_compressor::process_backend()
	{
		debug_printf("basis_compressor::process_backend\n");

		basisu_backend_params backend_params;
		backend_params.m_debug = m_params.m_debug;
		backend_params.m_debug_images = m_params.m_debug_images;
		backend_params.m_etc1s = true;
		backend_params.m_compression_level = m_params.m_compression_level;
		
		if (!m_params.m_no_endpoint_rdo)
			backend_params.m_endpoint_rdo_quality_thresh = m_params.m_endpoint_rdo_thresh;

		if (!m_params.m_no_selector_rdo)
			backend_params.m_selector_rdo_quality_thresh = m_params.m_selector_rdo_thresh;
				
		backend_params.m_used_global_codebooks = m_frontend.get_params().m_pGlobal_codebooks != nullptr;
		backend_params.m_validate = m_params.m_validate_output_data;

		m_backend.init(&m_frontend, backend_params, m_slice_descs);
		uint32_t total_packed_bytes = m_backend.encode();

		if (!total_packed_bytes)
		{
			error_printf("basis_compressor::encode() failed!\n");
			return false;
		}

		debug_printf("Total packed bytes (estimated): %u\n", total_packed_bytes);

		return true;
	}